

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniGUI.c
# Opt level: O2

void EPD_DrawMatrix(uint16_t Xpos,uint16_t Ypos,uint16_t Width,uint16_t High,uint16_t *Matrix)

{
  ushort uVar1;
  ulong uVar2;
  undefined6 in_register_0000000a;
  undefined6 in_register_00000012;
  ulong uVar3;
  
  for (uVar2 = 0; uVar2 != (CONCAT62(in_register_0000000a,High) & 0xffffffff); uVar2 = uVar2 + 1) {
    for (uVar3 = 0; (CONCAT62(in_register_00000012,Width) & 0xffffffff) != uVar3; uVar3 = uVar3 + 1)
    {
      uVar1 = Matrix[uVar3];
      EPD_DrawPixel((short)uVar3 + Xpos,Ypos,
                    (uint8_t)((ulong)((uVar1 & 0x1f) * 0x390 +
                                      (uVar1 >> 3 & 0xfc) * 0x24b + (uVar1 >> 8 & 0xfffffff8) * 299
                                     + 500) / 1000));
    }
    Ypos = Ypos + 1;
    Matrix = Matrix + 0x226;
  }
  return;
}

Assistant:

void EPD_DrawMatrix(uint16_t Xpos, uint16_t Ypos,uint16_t Width, uint16_t High,const uint16_t* Matrix)
{
	uint16_t i,j,x,y;
	uint16_t R,G,B,temp;
	double Gray;
	
	for (y=0,j=Ypos;y<High;y++,j++)
	{
 		for (x=0,i=Xpos;x<Width;x++,i++)
		{
			temp = Matrix[y*550+x];
			R = (temp >> 11)<<3;
			G = ((temp&0x07E0) >> 5)<<2;
			B = (temp&0x001F) <<3;
			Gray = (R*299 + G*587 + B*114 + 500) / 1000;
			EPD_DrawPixel(i, j, Gray);
		}
	}
}